

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O1

boolean boulder_hits_pool(obj *otmp,int rx,int ry,boolean pushing)

{
  undefined1 *puVar1;
  boolean bVar2;
  boolean bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  trap *ttmp;
  char *pcVar8;
  char *pcVar9;
  int tmp;
  int n;
  bool bVar10;
  
  if ((otmp == (obj *)0x0) || (otmp->otyp != 0x214)) {
    warning("Not a boulder?");
    return '\0';
  }
  bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if ((bVar2 != '\0') ||
     (((bVar2 = is_pool(level,rx,ry), bVar2 == '\0' && (bVar2 = is_lava(level,rx,ry), bVar2 == '\0')
       ) && (bVar2 = is_swamp(level,rx,ry), bVar2 == '\0')))) {
    return '\0';
  }
  bVar2 = is_lava(level,rx,ry);
  bVar3 = is_swamp(level,rx,ry);
  pcVar7 = waterbody_name((xchar)rx,(xchar)ry);
  cVar4 = level->locations[rx][ry].typ;
  uVar5 = mt_random();
  bVar10 = true;
  if (bVar3 == '\0') {
    if (bVar2 == '\0') {
      bVar10 = uVar5 % 10 != 0;
    }
    else {
      bVar10 = uVar5 % 10 == 0;
    }
  }
  if (bVar10) {
    ttmp = t_at(level,rx,ry);
    if (cVar4 == '\x14') {
      puVar1 = &level->locations[rx][ry].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe3f;
      puVar1 = &level->locations[rx][ry].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 | 0xc0;
    }
    else {
      level->locations[rx][ry].typ = '\x19';
    }
    if (ttmp != (trap *)0x0) {
      delfloortrap(ttmp);
    }
    bury_objs(rx,ry);
    newsym(rx,ry);
    if (pushing != '\0') {
      if (u.usteed == (monst *)0x0) {
        pcVar8 = xname(otmp);
        pcVar8 = the(pcVar8);
        pline("You push %s into the %s.",pcVar8,pcVar7);
      }
      else {
        pcVar8 = y_monnam(u.usteed);
        cVar4 = highc(*pcVar8);
        *pcVar8 = cVar4;
        pcVar9 = xname(otmp);
        pcVar9 = the(pcVar9);
        pline("%s pushes %s into the %s.",pcVar8,pcVar9,pcVar7);
      }
      if ((flags.verbose != '\0') &&
         ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
           && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
        pline("Now you can cross it!");
      }
    }
  }
  if ((bool)(pushing != '\0' & bVar10)) goto LAB_0016de77;
  if ((u._1052_1_ & 2) == 0) {
    if (pushing == '\0') {
      if ((viz_array[ry][rx] & 2U) == 0) goto LAB_0016dbf8;
LAB_0016dc60:
      pcVar8 = xname(otmp);
      pcVar8 = the(pcVar8);
      pcVar9 = "falls into";
      if (bVar10) {
        pcVar9 = "fills";
      }
      pline("There is a large splash as %s %s the %s.",pcVar8,pcVar9,pcVar7);
    }
    else {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) goto LAB_0016dc60;
LAB_0016dbf8:
      if (flags.soundok != '\0') {
        pcVar7 = " sizzling";
        if (bVar2 == '\0') {
          pcVar7 = "";
        }
        You_hear("a%s splash.",pcVar7);
      }
    }
    wake_nearto(rx,ry,0x28);
  }
  if (((bVar10) && ((u._1052_1_ & 2) != 0)) &&
     (iVar6 = dist2(rx,ry,(int)u.ux,(int)u.uy), iVar6 == 0)) {
    u._1052_1_ = u._1052_1_ & 0xfd;
    doredraw();
    vision_full_recalc = '\x01';
    pcVar7 = "You find yourself on dry land again!";
  }
  else {
    if ((bVar2 != '\0') && (iVar6 = dist2(rx,ry,(int)u.ux,(int)u.uy), iVar6 < 3)) {
      pline("You are hit by molten lava%c");
      n = 3;
      iVar6 = -3;
      do {
        uVar5 = mt_random();
        n = n + uVar5 % 6;
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0);
      fire_damageu(n,(monst *)0x0,"molten lava",1,0,'\0','\x01');
      goto LAB_0016de77;
    }
    if (bVar10 || flags.verbose == '\0') goto LAB_0016de77;
    if (pushing == '\0') {
      if ((viz_array[ry][rx] & 2U) == 0) goto LAB_0016de77;
    }
    else if (((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_0016de77;
    pcVar7 = "It sinks without a trace!";
  }
  pline(pcVar7);
LAB_0016de77:
  if (pushing == '\0') {
    obfree(otmp,(obj *)0x0);
  }
  else {
    delobj(otmp);
  }
  return '\x01';
}

Assistant:

boolean boulder_hits_pool(struct obj *otmp, int rx, int ry, boolean pushing)
{
	if (!otmp || otmp->otyp != BOULDER)
	    warning("Not a boulder?");
	else if (!Is_waterlevel(&u.uz) &&
		 (is_pool(level, rx,ry) || is_lava(level, rx,ry) ||
		  is_swamp(level, rx,ry))) {
	    boolean lava = is_lava(level, rx,ry), fills_up;
	    boolean swamp = is_swamp(level, rx,ry);
	    const char *what = waterbody_name(rx,ry);
	    schar ltyp = level->locations[rx][ry].typ;
	    int chance = rn2(10);		/* water: 90%; lava: 10% */
	    fills_up = swamp ? TRUE : lava ? chance == 0 : chance != 0;

	    if (fills_up) {
		struct trap *ttmp = t_at(level, rx, ry);

		if (ltyp == DRAWBRIDGE_UP) {
		    level->locations[rx][ry].drawbridgemask &= ~DB_UNDER; /* clear lava */
		    level->locations[rx][ry].drawbridgemask |= DB_FLOOR;
		} else
		    level->locations[rx][ry].typ = ROOM;

		if (ttmp) delfloortrap(ttmp);
		bury_objs(rx, ry);
		
		newsym(rx,ry);
		if (pushing) {
		    if (u.usteed) {
			char *bp = y_monnam(u.usteed);
			*bp = highc(*bp); /* bp points to a static buffer */
			pline("%s pushes %s into the %s.",
			    bp, the(xname(otmp)), what);
		    } else
			pline("You push %s into the %s.", the(xname(otmp)), what);
		    if (flags.verbose && !Blind)
			pline("Now you can cross it!");
		    /* no splashing in this case */
		}
	    }
	    if (!fills_up || !pushing) {	/* splashing occurs */
		if (!u.uinwater) {
		    if (pushing ? !Blind : cansee(rx,ry)) {
			pline("There is a large splash as %s %s the %s.",
			      the(xname(otmp)), fills_up? "fills":"falls into",
			      what);
		    } else if (flags.soundok)
			You_hear("a%s splash.", lava ? " sizzling" : "");
		    wake_nearto(rx, ry, 40);
		}

		if (fills_up && u.uinwater && distu(rx,ry) == 0) {
		    u.uinwater = 0;
		    doredraw();
		    vision_full_recalc = 1;
		    pline("You find yourself on dry land again!");
		} else if (lava && distu(rx,ry) <= 2) {
		    pline("You are hit by molten lava%c",
			  FFire_resistance ? '.' : '!');
		    fire_damageu(dice(3, 6), NULL, "molten lava", KILLED_BY,
				 0, FALSE, TRUE);
		} else if (!fills_up && flags.verbose &&
			   (pushing ? !Blind : cansee(rx,ry)))
		    pline("It sinks without a trace!");
	    }

	    /* boulder is now gone */
	    if (pushing) delobj(otmp);
	    else obfree(otmp, NULL);
	    return TRUE;
	}
	return FALSE;
}